

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O0

void __thiscall
duckdb::PerfectAggregateHashTable::Combine
          (PerfectAggregateHashTable *this,PerfectAggregateHashTable *other)

{
  TupleDataLayout *layout;
  Vector *sources;
  type args;
  type pbVar1;
  idx_t count;
  type __x;
  long in_RSI;
  idx_t in_RDI;
  bool has_entry_source;
  idx_t i;
  RowOperationsState row_state;
  idx_t combine_count;
  data_ptr_t target_ptr;
  data_ptr_t source_ptr;
  uchar **target_addresses_ptr;
  uchar **source_addresses_ptr;
  Vector target_addresses;
  Vector source_addresses;
  ArenaAllocator *in_stack_fffffffffffffe48;
  type in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe68;
  LogicalTypeId id;
  LogicalType *in_stack_fffffffffffffe70;
  LogicalType *type_p;
  Vector *in_stack_fffffffffffffe90;
  ulong local_160;
  long local_148;
  Vector *targets;
  RowOperationsState *in_stack_fffffffffffffee0;
  LogicalType local_90 [5];
  long local_10;
  
  id = (LogicalTypeId)((ulong)in_stack_fffffffffffffe68 >> 0x38);
  type_p = local_90;
  local_10 = in_RSI;
  LogicalType::LogicalType(in_stack_fffffffffffffe70,id);
  Vector::Vector(in_stack_fffffffffffffe90,type_p,in_RDI);
  LogicalType::~LogicalType((LogicalType *)0x79e681);
  LogicalType::LogicalType(in_stack_fffffffffffffe70,id);
  Vector::Vector(in_stack_fffffffffffffe90,type_p,in_RDI);
  LogicalType::~LogicalType((LogicalType *)0x79e6be);
  layout = (TupleDataLayout *)FlatVector::GetData<unsigned_char*>((Vector *)0x79e6cb);
  sources = (Vector *)FlatVector::GetData<unsigned_char*>((Vector *)0x79e6ec);
  targets = *(Vector **)(local_10 + 0xf8);
  count = *(idx_t *)(in_RDI + 0xf8);
  local_148 = 0;
  args = unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
         operator*((unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
                    *)in_stack_fffffffffffffe50);
  RowOperationsState::RowOperationsState
            ((RowOperationsState *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  for (local_160 = 0; local_160 < *(ulong *)(in_RDI + 0xe0); local_160 = local_160 + 1) {
    pbVar1 = unique_ptr<bool[],_std::default_delete<bool>,_false>::operator[]
                       ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)
                        in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    if ((*pbVar1 & 1U) != 0) {
      pbVar1 = unique_ptr<bool[],_std::default_delete<bool>,_false>::operator[]
                         ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)
                          in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      *pbVar1 = true;
      (&(layout->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start)[local_148] = (pointer)targets;
      *(idx_t *)(&sources->vector_type + local_148 * 8) = count;
      local_148 = local_148 + 1;
      if (local_148 == 0x800) {
        in_stack_fffffffffffffe50 =
             shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                       ((shared_ptr<duckdb::TupleDataLayout,_true> *)in_stack_fffffffffffffe50);
        RowOperations::CombineStates(in_stack_fffffffffffffee0,layout,sources,targets,count);
        local_148 = 0;
      }
    }
    targets = (Vector *)(&targets->vector_type + *(long *)(in_RDI + 0xe8));
    count = count + *(long *)(in_RDI + 0xe8);
  }
  __x = shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                  ((shared_ptr<duckdb::TupleDataLayout,_true> *)in_stack_fffffffffffffe50);
  RowOperations::CombineStates(in_stack_fffffffffffffee0,layout,sources,targets,count);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  ::push_back((vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
               *)in_stack_fffffffffffffe50,(value_type *)__x);
  make_uniq<duckdb::ArenaAllocator,duckdb::Allocator&>((Allocator *)args);
  unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::operator=
            ((unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
              *)in_stack_fffffffffffffe50,
             (unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
              *)__x);
  unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
              *)0x79e9dd);
  RowOperationsState::~RowOperationsState((RowOperationsState *)0x79e9e7);
  Vector::~Vector((Vector *)in_stack_fffffffffffffe50);
  Vector::~Vector((Vector *)in_stack_fffffffffffffe50);
  return;
}

Assistant:

void PerfectAggregateHashTable::Combine(PerfectAggregateHashTable &other) {
	D_ASSERT(total_groups == other.total_groups);
	D_ASSERT(tuple_size == other.tuple_size);

	Vector source_addresses(LogicalType::POINTER);
	Vector target_addresses(LogicalType::POINTER);
	auto source_addresses_ptr = FlatVector::GetData<data_ptr_t>(source_addresses);
	auto target_addresses_ptr = FlatVector::GetData<data_ptr_t>(target_addresses);

	// iterate over all entries of both hash tables and call combine for all entries that can be combined
	data_ptr_t source_ptr = other.data;
	data_ptr_t target_ptr = data;
	idx_t combine_count = 0;
	RowOperationsState row_state(*aggregate_allocator);
	for (idx_t i = 0; i < total_groups; i++) {
		auto has_entry_source = other.group_is_set[i];
		// we only have any work to do if the source has an entry for this group
		if (has_entry_source) {
			group_is_set[i] = true;
			source_addresses_ptr[combine_count] = source_ptr;
			target_addresses_ptr[combine_count] = target_ptr;
			combine_count++;
			if (combine_count == STANDARD_VECTOR_SIZE) {
				RowOperations::CombineStates(row_state, *layout_ptr, source_addresses, target_addresses, combine_count);
				combine_count = 0;
			}
		}
		source_ptr += tuple_size;
		target_ptr += tuple_size;
	}
	RowOperations::CombineStates(row_state, *layout_ptr, source_addresses, target_addresses, combine_count);

	// FIXME: after moving the arena allocator, we currently have to ensure that the pointer is not nullptr, because the
	// FIXME: Destroy()-function of the hash table expects an allocator in some cases (e.g., for sorted aggregates)
	stored_allocators.push_back(std::move(other.aggregate_allocator));
	other.aggregate_allocator = make_uniq<ArenaAllocator>(allocator);
}